

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void hermite_poly_phys_coef(int n,double *c)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  double *c_local;
  int n_local;
  
  if (-1 < n) {
    for (local_1c = 0; local_1c <= n; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 <= n; local_20 = local_20 + 1) {
        c[local_1c + local_20 * (n + 1)] = 0.0;
      }
    }
    *c = 1.0;
    if (n != 0) {
      c[n + 2] = 2.0;
      for (local_1c = 2; local_1c <= n; local_1c = local_1c + 1) {
        c[local_1c] = (double)(local_1c + -1) * -2.0 * c[local_1c + -2];
        for (local_20 = 1; local_20 <= local_1c + -2; local_20 = local_20 + 1) {
          c[local_1c + local_20 * (n + 1)] =
               c[local_1c + -1 + (local_20 + -1) * (n + 1)] +
               c[local_1c + -1 + (local_20 + -1) * (n + 1)] +
               -((double)(local_1c + -1) * 2.0 * c[local_1c + -2 + local_20 * (n + 1)]);
        }
        c[local_1c + (local_1c + -1) * (n + 1)] = c[local_1c + -1 + (local_1c + -2) * (n + 1)] * 2.0
        ;
        c[local_1c + local_1c * (n + 1)] = c[local_1c + -1 + (local_1c + -1) * (n + 1)] * 2.0;
      }
    }
  }
  return;
}

Assistant:

void hermite_poly_phys_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_POLY_PHYS_COEF: coefficients of the physicist's Hermite polynomial H(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     2
//     2     -2     0      4
//     3      0   -12      0      8
//     4     12     0    -48      0      16
//     5      0   120      0   -160       0    32
//     6   -120     0    720      0    -480     0     64
//     7      0 -1680      0   3360       0 -1344      0   128
//     8   1680     0 -13440      0   13440     0  -3584     0    256
//     9      0 30240      0 -80640       0 48384      0 -9216      0 512
//    10 -30240     0 302400      0 -403200     0 161280     0 -23040   0 1024
//
//  Recursion:
//
//    H(0,X) = 1,
//    H(1,X) = 2*X,
//    H(N,X) = 2*X * H(N-1,X) - 2*(N-1) * H(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Hermite
//    polynomials.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 2.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)] = - 2.0 * double( i - 1 ) * c[i-2+0*(n+1)];
    for ( j = 1; j <= i-2; j++ )
    {
      c[i+j*(n+1)] =   2.0 * c[i-1+(j-1)*(n+1)] 
                     - 2.0 * double( i - 1 ) * c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] =  2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] =  2.0 * c[i-1+(i-1)*(n+1)];
  }

  return;
}